

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O2

int lj_cf_string_gsub(lua_State *L)

{
  char cVar1;
  lua_State *L_00;
  byte bVar2;
  char cVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  lua_Integer lVar7;
  char *e;
  char *pcVar8;
  int iVar9;
  ulong uVar10;
  int local_2280;
  size_t srcl;
  size_t l;
  MatchState ms;
  luaL_Buffer b;
  
  pcVar5 = luaL_checklstring(L,1,&srcl);
  iVar9 = 0;
  pcVar6 = luaL_checklstring(L,2,(size_t *)0x0);
  iVar4 = lua_type(L,3);
  lVar7 = luaL_optinteger(L,4,(long)((int)srcl + 1));
  cVar1 = *pcVar6;
  if (3 < iVar4 - 3U) {
    lj_err_arg(L,3,LJ_ERR_NOSFT);
  }
  luaL_buffinit(L,&b);
  ms.src_end = pcVar5 + CONCAT44(srcl._4_4_,(int)srcl);
  ms.src_init = pcVar5;
  ms.L = L;
  do {
    local_2280 = (int)lVar7;
    e = pcVar5;
    if (local_2280 <= iVar9) break;
    ms.level = 0;
    ms.depth = 0;
    e = match(&ms,pcVar5,pcVar6 + (cVar1 == '^'));
    L_00 = ms.L;
    if (e == (char *)0x0) {
LAB_00148676:
      e = pcVar5;
      if (ms.src_end <= pcVar5) break;
      if (&stack0xffffffffffffffd0 <= b.p) {
        luaL_prepbuffer(&b);
      }
      e = pcVar5 + 1;
      *b.p = *pcVar5;
      b.p = b.p + 1;
    }
    else {
      iVar4 = lua_type(ms.L,3);
      if (iVar4 - 3U < 2) {
        pcVar8 = lua_tolstring(L_00,3,&l);
        for (uVar10 = 0; uVar10 < l; uVar10 = uVar10 + 1) {
          cVar3 = pcVar8[uVar10];
          if (cVar3 == '%') {
            bVar2 = pcVar8[uVar10 + 1];
            uVar10 = uVar10 + 1;
            if ((""[(ulong)bVar2 + 1] & 8) == 0) {
              if (&stack0xffffffffffffffd0 <= b.p) {
                luaL_prepbuffer(&b);
                bVar2 = pcVar8[uVar10];
              }
              *b.p = bVar2;
              b.p = (char *)((byte *)b.p + 1);
            }
            else if (bVar2 == 0x30) {
              luaL_addlstring(&b,pcVar5,(long)e - (long)pcVar5);
            }
            else {
              push_onecapture(&ms,(char)bVar2 + -0x31,pcVar5,e);
              luaL_addvalue(&b);
            }
          }
          else {
            if (&stack0xffffffffffffffd0 <= b.p) {
              luaL_prepbuffer(&b);
              cVar3 = pcVar8[uVar10];
            }
            *b.p = cVar3;
            b.p = b.p + 1;
          }
        }
      }
      else {
        if (iVar4 == 5) {
          push_onecapture(&ms,0,pcVar5,e);
          lua_gettable(L_00,3);
        }
        else if (iVar4 == 6) {
          lua_pushvalue(L_00,3);
          iVar4 = push_captures(&ms,pcVar5,e);
          lua_call(L_00,iVar4,1);
        }
        iVar4 = lua_toboolean(L_00,-1);
        if (iVar4 == 0) {
          lua_settop(L_00,-2);
          lua_pushlstring(L_00,pcVar5,(long)e - (long)pcVar5);
        }
        else {
          iVar4 = lua_isstring(L_00,-1);
          if (iVar4 == 0) {
            iVar4 = lua_type(L_00,-1);
            pcVar5 = lua_typename(L_00,iVar4);
            lj_err_callerv(L_00,LJ_ERR_STRGSRV,pcVar5);
          }
        }
        luaL_addvalue(&b);
      }
      iVar9 = iVar9 + 1;
      if (e <= pcVar5) goto LAB_00148676;
    }
    pcVar5 = e;
  } while (cVar1 != '^');
  luaL_addlstring(&b,e,(long)ms.src_end - (long)e);
  luaL_pushresult(&b);
  lua_pushinteger(L,(long)iVar9);
  return 2;
}

Assistant:

LJLIB_CF(string_gsub)
{
  size_t srcl;
  const char *src = luaL_checklstring(L, 1, &srcl);
  const char *p = luaL_checkstring(L, 2);
  int  tr = lua_type(L, 3);
  int max_s = luaL_optint(L, 4, (int)(srcl+1));
  int anchor = (*p == '^') ? (p++, 1) : 0;
  int n = 0;
  MatchState ms;
  luaL_Buffer b;
  if (!(tr == LUA_TNUMBER || tr == LUA_TSTRING ||
	tr == LUA_TFUNCTION || tr == LUA_TTABLE))
    lj_err_arg(L, 3, LJ_ERR_NOSFT);
  luaL_buffinit(L, &b);
  ms.L = L;
  ms.src_init = src;
  ms.src_end = src+srcl;
  while (n < max_s) {
    const char *e;
    ms.level = ms.depth = 0;
    e = match(&ms, src, p);
    if (e) {
      n++;
      add_value(&ms, &b, src, e);
    }
    if (e && e>src) /* non empty match? */
      src = e;  /* skip it */
    else if (src < ms.src_end)
      luaL_addchar(&b, *src++);
    else
      break;
    if (anchor)
      break;
  }
  luaL_addlstring(&b, src, (size_t)(ms.src_end-src));
  luaL_pushresult(&b);
  lua_pushinteger(L, n);  /* number of substitutions */
  return 2;
}